

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GenUnionCreatorForStruct
          (PythonGenerator *this,EnumDef *enum_def,EnumVal *ev,string *code_ptr)

{
  IdlNamer *pIVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string package_reference;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string field_type;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string variant;
  string union_type;
  
  pIVar1 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&union_type,pIVar1,enum_def);
  (*(this->namer_).super_Namer._vptr_Namer[0x13])(&variant,pIVar1,ev);
  (*(pIVar1->super_Namer)._vptr_Namer[0x11])(&field_type,pIVar1,(ev->union_type).struct_def);
  GenIndents_abi_cxx11_(&local_a0,this,1);
  std::operator+(&local_80,&local_a0,"if unionType == ");
  std::operator+(&local_e0,&local_80,&union_type);
  std::operator+(&local_140,&local_e0,".");
  std::operator+(&local_120,&local_140,&variant);
  std::operator+(&package_reference,&local_120,":");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&package_reference);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  if ((((this->super_BaseGenerator).parser_)->opts).include_dependence_headers == true) {
    GenPackageReference_abi_cxx11_(&package_reference,this,&ev->union_type);
    GenIndents_abi_cxx11_(&local_e0,this,2);
    std::operator+(&local_140,&local_e0,"import ");
    std::operator+(&local_120,&local_140,&package_reference);
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_e0);
    std::operator+(&local_140,&package_reference,".");
    std::operator+(&local_120,&local_140,&field_type);
    std::__cxx11::string::operator=((string *)&field_type,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&package_reference);
  }
  GenIndents_abi_cxx11_(&local_e0,this,2);
  std::operator+(&local_140,&local_e0,"return ");
  std::operator+(&local_120,&local_140,&field_type);
  std::operator+(&package_reference,&local_120,".InitFromBuf(table.Bytes, table.Pos)");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&package_reference);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&field_type);
  std::__cxx11::string::~string((string *)&variant);
  std::__cxx11::string::~string((string *)&union_type);
  return;
}

Assistant:

void GenUnionCreatorForStruct(const EnumDef &enum_def, const EnumVal &ev,
                                std::string *code_ptr) const {
    auto &code = *code_ptr;
    const auto union_type = namer_.Type(enum_def);
    const auto variant = namer_.Variant(ev);
    auto field_type = namer_.ObjectType(*ev.union_type.struct_def);

    code +=
        GenIndents(1) + "if unionType == " + union_type + "." + variant + ":";
    if (parser_.opts.include_dependence_headers) {
      auto package_reference = GenPackageReference(ev.union_type);
      code += GenIndents(2) + "import " + package_reference;
      field_type = package_reference + "." + field_type;
    }
    code += GenIndents(2) + "return " + field_type +
            ".InitFromBuf(table.Bytes, table.Pos)";
  }